

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void mbedtls_debug_print_buf
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,uchar *buf,
               size_t len)

{
  char cVar1;
  int iVar2;
  long local_268;
  size_t idx;
  size_t i;
  char txt [17];
  char local_238 [8];
  char str [512];
  uchar *buf_local;
  char *text_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  if (((ssl->conf != (mbedtls_ssl_config *)0x0) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    str._504_8_ = buf;
    snprintf(local_238,0x200,"dumping \'%s\' (%u bytes)\n",text,len & 0xffffffff);
    debug_send_line(ssl,level,file,line,local_238);
    local_268 = 0;
    memset(&i,0,0x11);
    for (idx = 0; (idx < len && (idx < 0x1000)); idx = idx + 1) {
      if ((idx & 0xf) == 0) {
        if (idx != 0) {
          snprintf(local_238 + local_268,0x200 - local_268,"  %s\n",&i);
          debug_send_line(ssl,level,file,line,local_238);
          local_268 = 0;
          memset(&i,0,0x11);
        }
        iVar2 = snprintf(local_238 + local_268,0x200 - local_268,"%04x: ",idx & 0xffffffff);
        local_268 = iVar2 + local_268;
      }
      iVar2 = snprintf(local_238 + local_268,0x200 - local_268," %02x",
                       (ulong)*(byte *)(str._504_8_ + idx));
      local_268 = iVar2 + local_268;
      if ((*(byte *)(str._504_8_ + idx) < 0x20) || (0x7e < *(byte *)(str._504_8_ + idx))) {
        cVar1 = '.';
      }
      else {
        cVar1 = *(char *)(str._504_8_ + idx);
      }
      txt[(idx & 0xf) - 8] = cVar1;
    }
    if (len != 0) {
      for (; (idx & 0xf) != 0; idx = idx + 1) {
        iVar2 = snprintf(local_238 + local_268,0x200 - local_268,"   ");
        local_268 = iVar2 + local_268;
      }
      snprintf(local_238 + local_268,0x200 - local_268,"  %s\n",&i);
      debug_send_line(ssl,level,file,line,local_238);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_buf( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line, const char *text,
                      const unsigned char *buf, size_t len )
{
    char str[DEBUG_BUF_SIZE];
    char txt[17];
    size_t i, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || level > debug_threshold )
        return;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "dumping '%s' (%u bytes)\n",
              text, (unsigned int) len );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    memset( txt, 0, sizeof( txt ) );
    for( i = 0; i < len; i++ )
    {
        if( i >= 4096 )
            break;

        if( i % 16 == 0 )
        {
            if( i > 0 )
            {
                mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
                debug_send_line( ssl, level, file, line, str );

                idx = 0;
                memset( txt, 0, sizeof( txt ) );
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "%04x: ",
                             (unsigned int) i );

        }

        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x",
                         (unsigned int) buf[i] );
        txt[i % 16] = ( buf[i] > 31 && buf[i] < 127 ) ? buf[i] : '.' ;
    }

    if( len > 0 )
    {
        for( /* i = i */; i % 16 != 0; i++ )
            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "   " );

        mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
        debug_send_line( ssl, level, file, line, str );
    }
}